

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_setoneret(FuncState *fs,expdesc *e)

{
  Instruction *pIVar1;
  char *format;
  
  if (e->k == VVARARG) {
    *(undefined1 *)((long)fs->f->code + (long)(e->u).info * 4 + 3) = 2;
    if (((byte)ravi_parser_debug & 2) != 0) {
      raviY_printf(fs,"[%d]* %o ; set B to 2\n",(long)(e->u).info,(ulong)fs->f->code[(e->u).info]);
    }
    e->k = VRELOCABLE;
    if (((byte)ravi_parser_debug & 1) != 0) {
      format = "luaK_setoneret (VVARARG->VRELOCABLE) %e\n";
LAB_001268a7:
      raviY_printf(fs,format,e);
      return;
    }
  }
  else if (e->k == VCALL) {
    pIVar1 = fs->f->code;
    if (*(char *)((long)pIVar1 + (long)(e->u).info * 4 + 2) != '\x02') {
      __assert_fail("((int)(((((fs)->f->code[(e)->u.info]))>>16)&0xff)) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x22d,"void luaK_setoneret(FuncState *, expdesc *)");
    }
    e->k = VNONRELOC;
    (e->u).info = pIVar1[(e->u).info] >> 8 & 0x7f;
    if (((byte)ravi_parser_debug & 1) != 0) {
      format = "luaK_setoneret (VCALL->VNONRELOC) %e\n";
      goto LAB_001268a7;
    }
  }
  return;
}

Assistant:

void luaK_setoneret (FuncState *fs, expdesc *e) {
  if (e->k == VCALL) {  /* expression is an open function call? */
    /* already returns 1 value */
    lua_assert(GETARG_C(getinstruction(fs, e)) == 2);
    e->k = VNONRELOC;  /* result has fixed position */
    e->u.info = GETARG_A(getinstruction(fs, e));
    DEBUG_EXPR(raviY_printf(fs, "luaK_setoneret (VCALL->VNONRELOC) %e\n", e));
  }
  else if (e->k == VVARARG) {
    SETARG_B(getinstruction(fs, e), 2);
    DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set B to 2\n", e->u.info, getinstruction(fs,e)));
    e->k = VRELOCABLE;  /* can relocate its simple result */
    DEBUG_EXPR(raviY_printf(fs, "luaK_setoneret (VVARARG->VRELOCABLE) %e\n", e));
  }
}